

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonToken.cpp
# Opt level: O2

string * __thiscall
CommonToken::toString_abi_cxx11_(string *__return_storage_ptr__,CommonToken *this)

{
  string sStack_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (*(this->super_Token)._vptr_Token[2])(&local_38);
  std::operator+(&local_d8,"[\"",&local_38);
  std::operator+(&local_b8,&local_d8,"\",<");
  std::__cxx11::to_string(&local_f8,(this->super_Token).type);
  std::operator+(&local_98,&local_b8,&local_f8);
  std::operator+(&local_78,&local_98,">,line=");
  std::__cxx11::to_string(&sStack_118,*(int *)&(this->super_Token).field_0xc);
  std::operator+(&local_58,&local_78,&sStack_118);
  std::operator+(__return_storage_ptr__,&local_58,"]");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&sStack_118);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string CommonToken::toString() const
{
	return "[\""+getText()+"\",<"+std::to_string(type)+">,line="+std::to_string(line)+"]";
}